

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

void __thiscall
cs_impl::runtime_cs_ext::async_callable::async_callable
          (async_callable *this,var *fn,vector *data,array *append_args)

{
  pointer paVar1;
  callable *pcVar2;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_68;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_48;
  
  pcVar2 = any::const_val<cs::callable>(fn);
  cs::callable::callable(&this->func,pcVar2);
  paVar1 = (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start =
       (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = paVar1;
  (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (data->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_cur =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_48._M_first =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_48._M_last =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_48._M_node =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_68._M_cur =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_68._M_first =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_68._M_last =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_68._M_node =
       (append_args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
  insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
            ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&this->args,
             (this->args).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_48,&local_68);
  detach_args(this);
  return;
}

Assistant:

async_callable(const var &fn, vector data, const array &append_args) : func(fn.const_val<callable>()), args(std::move(data))
			{
				args.insert(args.end(), append_args.begin(), append_args.end());
				detach_args();
			}